

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

void __thiscall
cmDocumentation::SetSection
          (cmDocumentation *this,char *name,
          vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *docs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmDocumentationSection sec;
  allocator<char> local_99;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  char local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  pointer local_78;
  pointer pcStack_70;
  pointer local_68;
  cmDocumentationSection local_60;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,name,&local_99);
  local_78 = (pointer)0x0;
  pcStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<cmDocumentationEntry_const*,std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>>>
            ((vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>> *)&local_78,0,
             (docs->super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>)
             ._M_impl.super__Vector_impl_data._M_start,
             (docs->super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>)
             ._M_impl.super__Vector_impl_data._M_finish);
  paVar1 = &local_60.Name.field_2;
  if (local_98 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_88) {
    local_60.Name.field_2._8_8_ = uStack_80;
    local_60.Name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.Name._M_dataplus._M_p = (pointer)local_98;
  }
  local_60.Name.field_2._M_allocated_capacity._1_7_ = uStack_87;
  local_60.Name.field_2._M_local_buf[0] = local_88;
  local_60.Name._M_string_length = local_90;
  local_90 = 0;
  local_88 = '\0';
  local_60.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = local_78;
  local_60.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = pcStack_70;
  local_60.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_68;
  local_68 = (pointer)0x0;
  local_78 = (pointer)0x0;
  pcStack_70 = (pointer)0x0;
  local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&local_88;
  SetSection(this,name,&local_60);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
            (&local_60.Entries);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.Name._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.Name._M_dataplus._M_p,local_60.Name.field_2._M_allocated_capacity + 1);
  }
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
            ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)&local_78);
  if (local_98 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return;
}

Assistant:

void cmDocumentation::SetSection(const char* name,
                                 std::vector<cmDocumentationEntry>& docs)
{
  cmDocumentationSection sec{ name };
  sec.Append(docs);
  this->SetSection(name, std::move(sec));
}